

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *this;
  undefined1 local_140 [8];
  Atmosphere A;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  double local_30;
  double hstep;
  double hmax;
  double hmin;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  hmin = (double)argv;
  argv_local._0_4_ = argc;
  if (argc == 4) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_51);
    hmax = std::__cxx11::stod(&local_50,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    pcVar1 = *(char **)((long)hmin + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
    hstep = std::__cxx11::stod(&local_88,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    pcVar1 = *(char **)((long)hmin + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,pcVar1,
               (allocator<char> *)
               ((long)&A.layers.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    local_30 = std::__cxx11::stod(&local_b0,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&A.layers.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
  }
  else {
    hmax = 0.0;
    hstep = 80000.0;
    local_30 = 100.0;
  }
  Atmosphere::Atmosphere((Atmosphere *)local_140);
  Atmosphere::print_tabular((Atmosphere *)local_140,hmax,hstep,local_30);
  this = std::operator<<((ostream *)&std::cout,"\nPress Enter to Exit");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::istream::ignore();
  argv_local._4_4_ = 0;
  Atmosphere::~Atmosphere((Atmosphere *)local_140);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {

    double hmin, hmax, hstep;

    if (argc == 4) {
        hmin = std::stod(argv[1]);
        hmax = std::stod(argv[2]);
        hstep = std::stod(argv[3]);
    } else {
        hmin = 0;
        hmax = 80000.0;
        hstep = 100.0;
    }

    Atmosphere A = Atmosphere();
    A.print_tabular(hmin, hmax, hstep);

    // Just to keep console window open
    std::cout << "\nPress Enter to Exit" << std::endl;
    std::cin.ignore();

    return 0;
}